

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O0

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<10,_6,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  Matrix<float,_3,_2> *extraout_RDX;
  Matrix<float,_3,_2> *extraout_RDX_00;
  Matrix<float,_3,_2> *mat;
  VecAccess<float,_4,_3> local_80;
  Matrix<float,_3,_2> local_54;
  Vector<float,_3> local_3c;
  undefined1 local_30 [8];
  Type in0;
  InputType in1Type_local;
  InputType in0Type_local;
  ShaderEvalContext *evalCtx_local;
  
  in0.m_data.m_data[1].m_data[1] = (float)in1Type;
  in0.m_data.m_data[1].m_data[2] = (float)in0Type;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,6>((Mat2x3 *)local_30,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX
                      );
    mat = extraout_RDX;
  }
  else {
    getInputValue<0,6>((Mat2x3 *)local_30,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX
                      );
    mat = extraout_RDX_00;
  }
  negate<float,3,2>(&local_54,(MatrixCaseUtils *)local_30,mat);
  MatrixCaseUtils::reduceToVec3((MatrixCaseUtils *)&local_3c,&local_54);
  tcu::Vector<float,_4>::xyz(&local_80,&evalCtx->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_80,&local_3c);
  tcu::Matrix<float,_3,_2>::~Matrix(&local_54);
  tcu::Matrix<float,_3,_2>::~Matrix((Matrix<float,_3,_2> *)local_30);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(negate(in0));
	}